

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::HMMSegment::Cut
          (HMMSegment *this,string *sentence,
          vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  Range RVar1;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> wrs;
  PreFilter pre_filter;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_1a8;
  PreFilter local_190;
  
  PreFilter::PreFilter(&local_190,&(this->super_SegmentBase).symbols_,sentence);
  local_1a8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
            (&local_1a8,sentence->_M_string_length >> 1);
  while (local_190.cursor_ != local_190.sentence_.ptr_ + local_190.sentence_.size_) {
    RVar1 = PreFilter::Next(&local_190);
    Cut(this,RVar1.begin,RVar1.end,&local_1a8);
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::clear(words);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::reserve
            (words,(long)local_1a8.
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1a8.
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
  GetWordsFromWordRanges(sentence,&local_1a8,words);
  if (local_1a8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((RuneStrArray *)local_190.sentence_.ptr_ != &local_190.sentence_) {
    free(local_190.sentence_.ptr_);
  }
  return;
}

Assistant:

void Cut(const string& sentence, 
        vector<Word>& words) const {
    PreFilter pre_filter(symbols_, sentence);
    PreFilter::Range range;
    vector<WordRange> wrs;
    wrs.reserve(sentence.size()/2);
    while (pre_filter.HasNext()) {
      range = pre_filter.Next();
      Cut(range.begin, range.end, wrs);
    }
    words.clear();
    words.reserve(wrs.size());
    GetWordsFromWordRanges(sentence, wrs, words);
  }